

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O3

_Bool build_staircase(chunk *c,loc_conflict centre,wchar_t rating)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  connector *pcVar5;
  loc *plVar6;
  _Bool _Var7;
  wchar_t bx2;
  loc_conflict top_left;
  loc_conflict bottom_right;
  undefined4 in_register_00000014;
  dun_data *pdVar8;
  wchar_t by1;
  wchar_t bx1;
  long lVar9;
  loc grid;
  wchar_t by2;
  int iVar10;
  int local_60;
  loc_conflict rg;
  
  pcVar5 = dun->curr_join;
  if (pcVar5 == (connector *)0x0) {
    quit_fmt("build_staircase() called without dun->curr_join set",centre,
             CONCAT44(in_register_00000014,rating));
  }
  if ((((c->height <= centre.y) || (c->width <= centre.x)) &&
      (wVar1 = (pcVar5->grid).y, L'\0' < wVar1)) &&
     (wVar2 = (pcVar5->grid).x, L'\0' < wVar2 && wVar1 <= c->height + L'\xfffffffe')) {
    if (c->width + L'\xfffffffe' < wVar2) {
      return false;
    }
    top_left = loc((((uint)wVar2 < 2) - 2) + wVar2,(wVar1 == L'\x01' | 0xfffffffe) + wVar1);
    bottom_right = loc((uint)(wVar2 < c->width + L'\xfffffffe') + wVar2 + 1,
                       (uint)(wVar1 < c->height + L'\xfffffffe') + wVar1 + 1);
    local_60 = top_left.y;
    event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,(bottom_right.y - local_60) + L'\x01',
                      (bottom_right.x - top_left.x) + L'\x01');
    pdVar8 = dun;
    wVar3 = dun->block_hgt;
    wVar4 = dun->block_wid;
    bx1 = (wchar_t)((long)((ulong)(uint)(top_left.x >> 0x1f) << 0x20 | (ulong)top_left & 0xffffffff)
                   / (long)wVar4);
    bx2 = (wchar_t)((long)((ulong)(uint)(bottom_right.x >> 0x1f) << 0x20 |
                          (ulong)bottom_right & 0xffffffff) / (long)wVar4);
    by2 = (wchar_t)((long)((ulong)(uint)(bottom_right.y >> 0x1f) << 0x20 |
                          (ulong)bottom_right >> 0x20) / (long)wVar3);
    by1 = (wchar_t)((long)((ulong)(uint)(local_60 >> 0x1f) << 0x20 | (ulong)top_left >> 0x20) /
                   (long)wVar3);
    if (wVar3 < L'\x02' && wVar4 < L'\x02') {
      _Var7 = check_for_unreserved_blocks(by1,bx1,by2,bx2);
      if (_Var7) goto LAB_00153b31;
    }
    else {
      _Var7 = cave_find_in_range((chunk_conflict *)c,&rg,top_left,bottom_right,square_isroom);
      pdVar8 = dun;
      if (!_Var7) {
LAB_00153b31:
        if (by1 <= by2) {
          lVar9 = (long)by1;
          iVar10 = (by2 - by1) + 1;
          do {
            if (bx1 <= bx2) {
              memset(pdVar8->room_map[lVar9] + bx1,1,(ulong)(uint)(bx2 - bx1) + 1);
            }
            lVar9 = lVar9 + 1;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        wVar3 = pdVar8->cent_n;
        if (wVar3 < (int)(uint)z_info->level_room_max) {
          plVar6 = pdVar8->cent;
          plVar6[wVar3].x = wVar2;
          plVar6[wVar3].y = wVar1;
          pdVar8->cent_n = pdVar8->cent_n + L'\x01';
        }
        generate_room(c,wVar1 + L'\xffffffff',wVar2 + L'\xffffffff',wVar1 + L'\x01',wVar2 + L'\x01',
                      L'\0');
        draw_rectangle(c,wVar1 + L'\xffffffff',wVar2 + L'\xffffffff',wVar1 + L'\x01',wVar2 + L'\x01'
                       ,FEAT_GRANITE,L'\f',false);
        grid.y = wVar1;
        grid.x = wVar2;
        square_set_feat((chunk_conflict *)c,grid,(uint)pcVar5->feat);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool build_staircase(struct chunk *c, struct loc centre, int rating)
{
	struct connector *join = dun->curr_join;

	if (!join) {
		quit_fmt("build_staircase() called without dun->curr_join set");
	}

	if (centre.y >= c->height || centre.x >= c->width) {
		/*
		 * Verify that there's space for the 1 x 1 room at the
		 * staircase location (3 x 3 including the walls; if not at
		 * an edge also want a one grid buffer around the walls so
		 * the wall piercings for tunneling will work).
		 */
		struct loc tl, br;
		int by1, bx1, by2, bx2;

		centre = join->grid;
		if (centre.y < 1 || centre.y > c->height - 2 || centre.x < 1 ||
			centre.x > c->width - 2) return false;
		tl = loc(centre.x - ((centre.x > 1) ? 2 : 1),
			centre.y - ((centre.y > 1) ? 2 : 1));
		br = loc(centre.x + ((centre.x < c->width - 2) ? 2 : 1),
			centre.y + ((centre.y < c->height - 2) ? 2 : 1));
		event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
			br.y - tl.y + 1, br.x - tl.x + 1);
		by1 = tl.y / dun->block_hgt;
		bx1 = tl.x / dun->block_wid;
		by2 = br.y / dun->block_hgt;
		bx2 = br.x / dun->block_wid;
		/*
		 * If the block size is greater than one, look for room flags
		 * rather than check the block map.  It's less efficient, but
		 * gives a better chance of success since multiple staircase
		 * rooms could be placed in a block if they're far enough apart.
		 */
		if (dun->block_hgt > 1 || dun->block_wid > 1) {
			struct loc rg;

			if (cave_find_in_range(c, &rg, tl, br, square_isroom))
				return false;
		} else if (!check_for_unreserved_blocks(by1, bx1, by2, bx2)) {
			return false;
		}

		reserve_blocks(by1, bx1, by2, bx2);

		/* Save the room location */
		if (dun->cent_n < z_info->level_room_max) {
			dun->cent[dun->cent_n] = centre;
			dun->cent_n++;
		}
	} else {
		/* Never works for the caller to set the location. */
		return false;
	}

	/* Generate new room and outer walls */
	generate_room(c, centre.y - 1, centre.x - 1, centre.y + 1, centre.x + 1,
				  false);
	draw_rectangle(c, centre.y - 1, centre.x - 1, centre.y + 1, centre.x + 1,
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Place the correct stair */
	square_set_feat(c, centre, join->feat);

	/* Success */
	return true;
}